

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O1

void __thiscall
front::symbol::FunctionSymbol::FunctionSymbol
          (FunctionSymbol *this,string *name,SymbolKind ret,int layerNum)

{
  pointer pcVar1;
  int iVar2;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR___cxa_pure_virtual_001efa58;
  (this->super_Symbol)._name._M_dataplus._M_p = (pointer)&(this->super_Symbol)._name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Symbol)._name,local_48,local_40 + (long)local_48);
  (this->super_Symbol)._layerNum = layerNum;
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR_kind_001efad0;
  this->_ret = ret;
  (this->_params).
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_params).
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_params).
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = Symbol::symbolId + 1;
  (this->super_Symbol).id = Symbol::symbolId;
  Symbol::symbolId = iVar2;
  return;
}

Assistant:

FunctionSymbol(string name, SymbolKind ret, int layerNum = 0)
      : _ret(ret), Symbol(name, layerNum) {
    id = Symbol::symbolId++;
  }